

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int luaopen_math(lua_State *L)

{
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0x1b);
  luaL_setfuncs(L,mathlib,0);
  lua_pushnumber(L,3.141592653589793);
  lua_setfield(L,-2,"pi");
  lua_pushnumber(L,INFINITY);
  lua_setfield(L,-2,"huge");
  lua_pushinteger(L,0x7fffffffffffffff);
  lua_setfield(L,-2,"maxinteger");
  lua_pushinteger(L,-0x8000000000000000);
  lua_setfield(L,-2,"mininteger");
  return 1;
}

Assistant:

LUAMOD_API int luaopen_math(lua_State *L) {
    luaL_newlib(L, mathlib);
    lua_pushnumber(L, PI);
    lua_setfield(L, -2, "pi");
    lua_pushnumber(L, (lua_Number) HUGE_VAL);
    lua_setfield(L, -2, "huge");
    lua_pushinteger(L, LUA_MAXINTEGER);
    lua_setfield(L, -2, "maxinteger");
    lua_pushinteger(L, LUA_MININTEGER);
    lua_setfield(L, -2, "mininteger");
    return 1;
}